

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

void __thiscall gtar::Record::operator=(Record *this,Record *rhs)

{
  Format FVar1;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->m_name);
  std::__cxx11::string::_M_assign((string *)&this->m_index);
  FVar1 = rhs->m_format;
  this->m_behavior = rhs->m_behavior;
  this->m_format = FVar1;
  this->m_resolution = rhs->m_resolution;
  return;
}

Assistant:

void Record::operator=(const Record &rhs)
    {
        m_group = rhs.m_group;
        m_name = rhs.m_name;
        m_index = rhs.m_index;
        m_behavior = rhs.m_behavior;
        m_format = rhs.m_format;
        m_resolution = rhs.m_resolution;
    }